

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
          (QMovableArrayOps<QModelIndex> *this,qsizetype i,QModelIndex *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QModelIndex *pQVar4;
  Inserter *in_RDX;
  QModelIndex *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QModelIndex tmp;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar7;
  Inserter *this_00;
  Inserter local_48;
  QArrayDataPointer<QModelIndex> *local_20;
  QModelIndex *local_18;
  QModelIndex *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QModelIndex>::needsDetach((QArrayDataPointer<QModelIndex> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QModelIndex>::freeSpaceAtEnd
                          ((QArrayDataPointer<QModelIndex> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QModelIndex>::end((QArrayDataPointer<QModelIndex> *)in_RDI);
      *(QArrayDataPointer<QModelIndex> **)pQVar4 = in_RDX->data;
      pQVar4->i = (quintptr)in_RDX->displaceFrom;
      (pQVar4->m).ptr = (QAbstractItemModel *)in_RDX->displaceTo;
      in_RDI->displaceTo = (QModelIndex *)((long)&in_RDI->displaceTo->r + 1);
      goto LAB_008eb5c4;
    }
    if ((in_RSI == (QModelIndex *)0x0) &&
       (qVar3 = QArrayDataPointer<QModelIndex>::freeSpaceAtBegin
                          ((QArrayDataPointer<QModelIndex> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QModelIndex>::begin((QArrayDataPointer<QModelIndex> *)0x8eb465);
      *(QArrayDataPointer<QModelIndex> **)(pQVar4 + -1) = in_RDX->data;
      pQVar4[-1].i = (quintptr)in_RDX->displaceFrom;
      pQVar4[-1].m.ptr = (QAbstractItemModel *)in_RDX->displaceTo;
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QModelIndex *)((long)&in_RDI->displaceTo->r + 1);
      goto LAB_008eb5c4;
    }
  }
  local_20 = in_RDX->data;
  local_18 = in_RDX->displaceFrom;
  local_10 = in_RDX->displaceTo;
  bVar5 = in_RDI->displaceTo != (QModelIndex *)0x0;
  uVar6 = bVar5 && in_RSI == (QModelIndex *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QModelIndex *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QModelIndex>::detachAndGrow
            ((QArrayDataPointer<QModelIndex> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QModelIndex **)
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff9c,uVar2))),
             (QArrayDataPointer<QModelIndex> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QModelIndex> *)
                              CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff9c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff88));
    Inserter::insertOne(in_RDI,(QModelIndex *)CONCAT17(uVar6,in_stack_ffffffffffffff88));
    Inserter::~Inserter(&local_48);
  }
  else {
    pQVar4 = QArrayDataPointer<QModelIndex>::begin((QArrayDataPointer<QModelIndex> *)0x8eb555);
    *(QArrayDataPointer<QModelIndex> **)(pQVar4 + -1) = local_20;
    pQVar4[-1].i = (quintptr)local_18;
    pQVar4[-1].m.ptr = (QAbstractItemModel *)local_10;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QModelIndex *)((long)&in_RDI->displaceTo->r + 1);
  }
LAB_008eb5c4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }